

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsontz.cpp
# Opt level: O2

OlsonTimeZone * __thiscall
icu_63::OlsonTimeZone::operator=(OlsonTimeZone *this,OlsonTimeZone *other)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int32_t *piVar4;
  int16_t iVar5;
  int iVar6;
  undefined4 extraout_var;
  SimpleTimeZone *pSVar7;
  
  this->canonicalID = other->canonicalID;
  piVar4 = other->transitionTimes32;
  this->transitionTimesPre32 = other->transitionTimesPre32;
  this->transitionTimes32 = piVar4;
  this->transitionTimesPost32 = other->transitionTimesPost32;
  iVar5 = other->transitionCount32;
  this->transitionCountPre32 = other->transitionCountPre32;
  this->transitionCount32 = iVar5;
  this->transitionCountPost32 = other->transitionCountPost32;
  this->typeCount = other->typeCount;
  uVar1 = *(undefined4 *)((long)&other->typeOffsets + 4);
  uVar2 = *(undefined4 *)&other->typeMapData;
  uVar3 = *(undefined4 *)((long)&other->typeMapData + 4);
  *(undefined4 *)&this->typeOffsets = *(undefined4 *)&other->typeOffsets;
  *(undefined4 *)((long)&this->typeOffsets + 4) = uVar1;
  *(undefined4 *)&this->typeMapData = uVar2;
  *(undefined4 *)((long)&this->typeMapData + 4) = uVar3;
  if (this->finalZone != (SimpleTimeZone *)0x0) {
    (*(this->finalZone->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[1])();
  }
  if (other->finalZone == (SimpleTimeZone *)0x0) {
    pSVar7 = (SimpleTimeZone *)0x0;
  }
  else {
    iVar6 = (*(other->finalZone->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject
              [0xc])();
    pSVar7 = (SimpleTimeZone *)CONCAT44(extraout_var,iVar6);
  }
  this->finalZone = pSVar7;
  this->finalStartYear = other->finalStartYear;
  this->finalStartMillis = other->finalStartMillis;
  this->finalZoneWithStartYear = (SimpleTimeZone *)0x0;
  this->initialRule = (InitialTimeZoneRule *)0x0;
  this->firstTZTransition = (TimeZoneTransition *)0x0;
  this->firstTZTransitionIdx = 0;
  this->firstFinalTZTransition = (TimeZoneTransition *)0x0;
  this->historicRules = (TimeArrayTimeZoneRule **)0x0;
  this->historicRuleCount = 0;
  LOCK();
  (this->transitionRulesInitOnce).fState.super___atomic_base<int>._M_i = 0;
  UNLOCK();
  return this;
}

Assistant:

OlsonTimeZone& OlsonTimeZone::operator=(const OlsonTimeZone& other) {
    canonicalID = other.canonicalID;

    transitionTimesPre32 = other.transitionTimesPre32;
    transitionTimes32 = other.transitionTimes32;
    transitionTimesPost32 = other.transitionTimesPost32;

    transitionCountPre32 = other.transitionCountPre32;
    transitionCount32 = other.transitionCount32;
    transitionCountPost32 = other.transitionCountPost32;

    typeCount = other.typeCount;
    typeOffsets = other.typeOffsets;
    typeMapData = other.typeMapData;

    delete finalZone;
    finalZone = (other.finalZone != 0) ?
        (SimpleTimeZone*) other.finalZone->clone() : 0;

    finalStartYear = other.finalStartYear;
    finalStartMillis = other.finalStartMillis;

    clearTransitionRules();

    return *this;
}